

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void check(QPDFMatrix *m,string *exp)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_38 [8];
  string u;
  string *exp_local;
  QPDFMatrix *m_local;
  
  u.field_2._8_8_ = exp;
  QPDFMatrix::unparse_abi_cxx11_((string *)local_38,m);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)u.field_2._8_8_);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"got ");
    poVar2 = std::operator<<(poVar2,(string *)local_38);
    poVar2 = std::operator<<(poVar2,", wanted ");
    poVar2 = std::operator<<(poVar2,(string *)u.field_2._8_8_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void
check(QPDFMatrix const& m, std::string const& exp)
{
    std::string u = m.unparse();
    if (u != exp) {
        std::cout << "got " << u << ", wanted " << exp << std::endl;
    }
}